

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O0

void __thiscall
Saturation::PredicateSplitPassiveClauseContainer::add
          (PredicateSplitPassiveClauseContainer *this,Clause *cl)

{
  Clause *pCVar1;
  pointer pPVar2;
  PredicateSplitPassiveClauseContainer *in_RSI;
  SingleParamEvent<Kernel::Clause_*> *in_RDI;
  uint i;
  uint bestQueueIndex;
  Clause *in_stack_ffffffffffffffd8;
  uint local_18;
  float in_stack_ffffffffffffffec;
  
  (*(code *)(in_RDI->super_BaseEvent)._handlers[10]._head)(in_RDI,in_RSI);
  local_18 = bestQueue(in_RSI,in_stack_ffffffffffffffec);
  if (((ulong)in_RDI[0x1c].super_BaseEvent._handlers & 1) == 0) {
    std::
    vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
    ::operator[]((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                  *)(in_RDI + 0x10),(ulong)local_18);
    pPVar2 = std::
             unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
             ::operator->((unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                           *)0xac96bc);
    (*(pPVar2->super_RandomAccessClauseContainer).super_ClauseContainer._vptr_ClauseContainer[2])
              (pPVar2,in_RSI);
  }
  else {
    while( true ) {
      in_stack_ffffffffffffffd8 = (Clause *)(ulong)local_18;
      pCVar1 = (Clause *)
               std::
               vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
               ::size((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                       *)(in_RDI + 0x10));
      if (pCVar1 <= in_stack_ffffffffffffffd8) break;
      std::
      vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
      ::operator[]((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                    *)(in_RDI + 0x10),(ulong)local_18);
      pPVar2 = std::
               unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
               ::operator->((unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                             *)0xac9680);
      (*(pPVar2->super_RandomAccessClauseContainer).super_ClauseContainer._vptr_ClauseContainer[2])
                (pPVar2,in_RSI);
      local_18 = local_18 + 1;
    }
  }
  if (((ulong)in_RDI[5].super_BaseEvent._handlers & 1) != 0) {
    Lib::SingleParamEvent<Kernel::Clause_*>::fire(in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void PredicateSplitPassiveClauseContainer::add(Clause* cl)
{
  ASS(cl->store() == Clause::PASSIVE);

  auto bestQueueIndex = bestQueue(evaluateFeature(cl));
  if (_layeredArrangement)
  {
    // add clause to all queues starting from best queue for clause
    for (unsigned i = bestQueueIndex; i < _queues.size(); i++)
    {
      _queues[i]->add(cl);
    }
  }
  else
  {
    // add clause to best queue for clause
    _queues[bestQueueIndex]->add(cl);
  }

  if (_isOutermost)
  {
    addedEvent.fire(cl);
  }

  ASS(cl->store() == Clause::PASSIVE);
}